

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ScaleLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_scale(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ScaleLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_scale(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_scale(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ScaleLayerParams>(arena);
    (this->layer_).scale_ = pSVar2;
  }
  return (ScaleLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScaleLayerParams* NeuralNetworkLayer::_internal_mutable_scale() {
  if (!_internal_has_scale()) {
    clear_layer();
    set_has_scale();
    layer_.scale_ = CreateMaybeMessage< ::CoreML::Specification::ScaleLayerParams >(GetArenaForAllocation());
  }
  return layer_.scale_;
}